

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_twod_square_circle(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  REF_INT RVar15;
  REF_INT cell;
  REF_INT local [27];
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 != 0) {
    pcVar12 = "create";
    uVar9 = 0x810;
    goto LAB_001296bf;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  local[4] = 1;
  pRVar1->twod = 1;
  iVar8 = ref_mpi->n;
  iVar5 = ref_mpi->id;
  iVar7 = 0;
  iVar4 = (int)(0x17 / (long)iVar8);
  iVar14 = iVar4 * iVar8;
  if (0x17 < iVar14) {
    iVar7 = ((((iVar8 + 0x17) / iVar8) * (iVar14 + -0x18)) / iVar4 - iVar14) + 0x18;
  }
  if (iVar5 == iVar7) {
LAB_00126d7d:
    uVar3 = ref_node_add(ref_node,0,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x823;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,1,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x824;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf] = 0.3333333333333333;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,2,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x825;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf] = 0.6666666666666666;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,3,local + 3);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x826;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2[lVar11 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[2],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar9 = 0x828;
      goto LAB_001296bf;
    }
    iVar14 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar8 = (iVar14 + 0x17) / iVar14;
    iVar4 = (int)(0x17 / (long)iVar14);
    iVar14 = iVar4 * iVar14;
    iVar13 = 0x18 - iVar14;
  }
  else {
    iVar8 = (iVar8 + 0x17) / iVar8;
    iVar7 = 0;
    if (iVar8 + 1U < 3) {
      iVar7 = iVar8;
    }
    iVar13 = 0x18 - iVar14;
    if (iVar13 <= iVar7) {
      iVar7 = (1 - iVar8 * iVar13) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_00126d7d;
    iVar7 = (int)(2 / (long)iVar8);
    if (iVar13 <= iVar7) {
      iVar7 = (2 - iVar8 * iVar13) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_00126d7d;
    iVar7 = (int)(3 / (long)iVar8);
    if (iVar13 <= iVar7) {
      iVar7 = (3 - iVar8 * iVar13) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_00126d7d;
  }
  local[4] = 2;
  iVar7 = (int)(3 / (long)iVar8);
  if (iVar13 <= iVar7) {
    iVar7 = (3 - iVar13 * iVar8) / iVar4 + iVar13;
  }
  if (iVar5 == iVar7) {
LAB_001272b8:
    uVar3 = ref_node_add(ref_node,3,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x838;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,4,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x839;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 0.3333333333333333;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,5,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x83a;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 0.6666666666666666;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,6,local + 3);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x83b;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 1.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[2],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar9 = 0x83d;
      goto LAB_001296bf;
    }
    iVar14 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar8 = (iVar14 + 0x17) / iVar14;
    iVar10 = (int)(6 / (long)iVar8);
    iVar4 = (int)(0x17 / (long)iVar14);
    iVar14 = iVar4 * iVar14;
    iVar13 = 0x18 - iVar14;
  }
  else {
    iVar7 = (int)(4 / (long)iVar8);
    if (iVar13 <= iVar7) {
      iVar7 = (4 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_001272b8;
    iVar7 = (int)(5 / (long)iVar8);
    if (iVar13 <= iVar7) {
      iVar7 = (5 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_001272b8;
    iVar10 = (int)(6 / (long)iVar8);
    iVar7 = iVar10;
    if (iVar13 <= iVar10) {
      iVar7 = (6 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_001272b8;
  }
  local[4] = 3;
  if (iVar13 <= iVar10) {
    iVar10 = (6 - iVar13 * iVar8) / iVar4 + iVar13;
  }
  if (iVar5 == iVar10) {
LAB_001277f4:
    uVar3 = ref_node_add(ref_node,6,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x84d;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 1.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,7,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x84e;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.6666666666666666;
    pRVar2[1] = 1.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,8,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x84f;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.3333333333333333;
    pRVar2[1] = 1.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,9,local + 3);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x850;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[2],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar9 = 0x852;
      goto LAB_001296bf;
    }
    iVar14 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar8 = (iVar14 + 0x17) / iVar14;
    iVar10 = (int)(9 / (long)iVar8);
    iVar4 = (int)(0x17 / (long)iVar14);
    iVar14 = iVar4 * iVar14;
    iVar13 = 0x18 - iVar14;
  }
  else {
    iVar7 = (int)(7 / (long)iVar8);
    if (iVar13 <= iVar7) {
      iVar7 = (7 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_001277f4;
    iVar7 = (int)(8 / (long)iVar8);
    if (iVar13 <= iVar7) {
      iVar7 = (8 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_001277f4;
    iVar10 = (int)(9 / (long)iVar8);
    iVar7 = iVar10;
    if (iVar13 <= iVar10) {
      iVar7 = (9 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_001277f4;
  }
  local[4] = 4;
  if (iVar13 <= iVar10) {
    iVar10 = (9 - iVar13 * iVar8) / iVar4 + iVar13;
  }
  if (iVar5 == iVar10) {
LAB_00127d2c:
    uVar3 = ref_node_add(ref_node,9,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x862;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,10,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x863;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0x55555555;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3fe55555;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0xb,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x864;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0x55555555;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3fd55555;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0,local + 3);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x865;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[2],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar9 = 0x867;
      goto LAB_001296bf;
    }
    iVar14 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar8 = (iVar14 + 0x17) / iVar14;
    iVar4 = (int)(0x17 / (long)iVar14);
    iVar13 = 0x18 - iVar4 * iVar14;
  }
  else {
    iVar7 = (int)(10 / (long)iVar8);
    if (iVar13 <= iVar7) {
      iVar7 = (10 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_00127d2c;
    iVar7 = (int)(0xb / (long)iVar8);
    if (iVar13 <= iVar7) {
      iVar7 = (0xb - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar7) goto LAB_00127d2c;
    iVar7 = 0;
    if (0x17 < iVar14) {
      iVar7 = (((iVar14 + -0x18) * iVar8) / iVar4 - iVar14) + 0x18;
    }
    if (iVar5 == iVar7) goto LAB_00127d2c;
  }
  local[4] = 5;
  iVar14 = (int)(0xc / (long)iVar8);
  if (iVar13 <= iVar14) {
    iVar14 = (0xc - iVar13 * iVar8) / iVar4 + iVar13;
  }
  if (iVar5 == iVar14) {
LAB_00128267:
    uVar3 = ref_node_add(ref_node,0xc,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x878;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.75;
    pRVar2[1] = 0.4999999999999984;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0xd,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x87a;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.7165063509461089;
    pRVar2[1] = 0.3749999999999987;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0xe,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x87c;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.6249999999999989;
    pRVar2[1] = 0.2834936490538897;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0xf,local + 3);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x87e;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.49999999999999883;
    pRVar2[1] = 0.25;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[2],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar9 = 0x880;
      goto LAB_001296bf;
    }
    iVar14 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar8 = (iVar14 + 0x17) / iVar14;
    iVar7 = (int)(0xf / (long)iVar8);
    iVar4 = (int)(0x17 / (long)iVar14);
    iVar13 = 0x18 - iVar4 * iVar14;
  }
  else {
    iVar14 = (int)(0xd / (long)iVar8);
    if (iVar13 <= iVar14) {
      iVar14 = (0xd - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_00128267;
    iVar14 = (int)(0xe / (long)iVar8);
    if (iVar13 <= iVar14) {
      iVar14 = (0xe - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_00128267;
    iVar7 = (int)(0xf / (long)iVar8);
    iVar14 = iVar7;
    if (iVar13 <= iVar7) {
      iVar14 = (0xf - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_00128267;
  }
  local[4] = 6;
  if (iVar13 <= iVar7) {
    iVar7 = (0xf - iVar13 * iVar8) / iVar4 + iVar13;
  }
  if (iVar5 == iVar7) {
LAB_001287a5:
    uVar3 = ref_node_add(ref_node,0xf,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x891;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.49999999999999883;
    pRVar2[1] = 0.25;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0x10,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x893;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.37499999999999895;
    pRVar2[1] = 0.28349364905389096;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0x11,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x895;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.2834936490538899;
    pRVar2[1] = 0.3750000000000007;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0x12,local + 3);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x897;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.25;
    pRVar2[1] = 0.5000000000000008;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[2],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar9 = 0x899;
      goto LAB_001296bf;
    }
    iVar14 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar8 = (iVar14 + 0x17) / iVar14;
    iVar7 = (int)(0x12 / (long)iVar8);
    iVar4 = (int)(0x17 / (long)iVar14);
    iVar13 = 0x18 - iVar4 * iVar14;
  }
  else {
    iVar14 = (int)(0x10 / (long)iVar8);
    if (iVar13 <= iVar14) {
      iVar14 = (0x10 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_001287a5;
    iVar14 = (int)(0x11 / (long)iVar8);
    if (iVar13 <= iVar14) {
      iVar14 = (0x11 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_001287a5;
    iVar7 = (int)(0x12 / (long)iVar8);
    iVar14 = iVar7;
    if (iVar13 <= iVar7) {
      iVar14 = (0x12 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_001287a5;
  }
  local[4] = 7;
  if (iVar13 <= iVar7) {
    iVar7 = (0x12 - iVar13 * iVar8) / iVar4 + iVar13;
  }
  if (iVar5 == iVar7) {
LAB_00128ce3:
    uVar3 = ref_node_add(ref_node,0x12,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x8aa;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.25;
    pRVar2[1] = 0.5000000000000008;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0x13,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x8ac;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.28349364905389063;
    pRVar2[1] = 0.6250000000000006;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0x14,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x8ae;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.37500000000000056;
    pRVar2[1] = 0.7165063509461099;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0x15,local + 3);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x8b0;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.5000000000000004;
    pRVar2[1] = 0.75;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[2],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar9 = 0x8b2;
      goto LAB_001296bf;
    }
    iVar14 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar8 = (iVar14 + 0x17) / iVar14;
    iVar7 = (int)(0x15 / (long)iVar8);
    iVar4 = (int)(0x17 / (long)iVar14);
    iVar13 = 0x18 - iVar4 * iVar14;
  }
  else {
    iVar14 = (int)(0x13 / (long)iVar8);
    if (iVar13 <= iVar14) {
      iVar14 = (0x13 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_00128ce3;
    iVar14 = (int)(0x14 / (long)iVar8);
    if (iVar13 <= iVar14) {
      iVar14 = (0x14 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_00128ce3;
    iVar7 = (int)(0x15 / (long)iVar8);
    iVar14 = iVar7;
    if (iVar13 <= iVar7) {
      iVar14 = (0x15 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_00128ce3;
  }
  local[4] = 8;
  if (iVar13 <= iVar7) {
    iVar7 = (0x15 - iVar13 * iVar8) / iVar4 + iVar13;
  }
  if (iVar5 == iVar7) {
LAB_00129219:
    uVar3 = ref_node_add(ref_node,0x15,local);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x8c3;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    lVar6 = -1;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.5000000000000004;
    pRVar2[1] = 0.75;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0x16,local + 1);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x8c5;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.6250000000000002;
    pRVar2[1] = 0.7165063509461095;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0x17,local + 2);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x8c7;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.7165063509461097;
    pRVar2[1] = 0.6249999999999999;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_node_add(ref_node,0xc,local + 3);
    if (uVar3 != 0) {
      pcVar12 = "add node";
      uVar9 = 0x8c9;
      goto LAB_001296bf;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.75;
    pRVar2[1] = 0.5;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar8 = ref_mpi->n;
    iVar5 = (iVar8 + 0x17) / iVar8;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(0x17 % (long)iVar8) + 1)) {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar15 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar14 = (int)(0x17 / (long)iVar8);
      iVar8 = 0x18 - iVar8 * iVar14;
      RVar15 = iVar8 + (int)((lVar6 - iVar5 * iVar8) / (long)iVar14);
    }
    ref_node->part[lVar11] = RVar15;
    uVar3 = ref_cell_add(pRVar1->cell[2],local,&cell);
    if (uVar3 != 0) {
      pcVar12 = "add tri";
      uVar9 = 0x8cb;
      goto LAB_001296bf;
    }
  }
  else {
    iVar14 = (int)(0x16 / (long)iVar8);
    if (iVar13 <= iVar14) {
      iVar14 = (0x16 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_00129219;
    iVar14 = (int)(0x17 / (long)iVar8);
    if (iVar13 <= iVar14) {
      iVar14 = (0x17 - iVar13 * iVar8) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_00129219;
    iVar14 = (int)(0xc / (long)iVar8);
    if (iVar13 <= iVar14) {
      iVar14 = (0xc - iVar8 * iVar13) / iVar4 + iVar13;
    }
    if (iVar5 == iVar14) goto LAB_00129219;
  }
  uVar3 = ref_node_initialize_n_global(ref_node,0x18);
  if (uVar3 == 0) {
    return 0;
  }
  pcVar12 = "init glob";
  uVar9 = 0x8ce;
LAB_001296bf:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar9,
         "ref_fixture_twod_square_circle",(ulong)uVar3,pcVar12);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_square_circle(REF_GRID *ref_grid_ptr,
                                                  REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 24;
  REF_DBL x0 = 0.5, y0 = 0.5, r = 0.25, t;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  local[4] = 1;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0 / 3.0, 0.0, 0.0);
    add_that_node(2, 2.0 / 3.0, 0.0, 0.0);
    add_that_node(3, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  local[4] = 2;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 0.0, 0.0);
    add_that_node(1, 1.0, 1.0 / 3.0, 0.0);
    add_that_node(2, 1.0, 2.0 / 3.0, 0.0);
    add_that_node(3, 1.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 6;
  global[1] = 7;
  global[2] = 8;
  global[3] = 9;
  local[4] = 3;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 1.0, 1.0, 0.0);
    add_that_node(1, 2.0 / 3.0, 1.0, 0.0);
    add_that_node(2, 1.0 / 3.0, 1.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 9;
  global[1] = 10;
  global[2] = 11;
  global[3] = 0;
  local[4] = 4;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 1.0, 0.0);
    add_that_node(1, 0.0, 2.0 / 3.0, 0.0);
    add_that_node(2, 0.0, 1.0 / 3.0, 0.0);
    add_that_node(3, 0.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 12;
  global[1] = 13;
  global[2] = 14;
  global[3] = 15;
  local[4] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (12.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (11.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (10.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (9.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 15;
  global[1] = 16;
  global[2] = 17;
  global[3] = 18;
  local[4] = 6;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (9.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (8.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (7.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (6.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 18;
  global[1] = 19;
  global[2] = 20;
  global[3] = 21;
  local[4] = 7;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (6.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (5.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (4.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (3.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  global[0] = 21;
  global[1] = 22;
  global[2] = 23;
  global[3] = 12;
  local[4] = 8;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    t = ref_math_pi * (3.0 / 6.0);
    add_that_node(0, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (2.0 / 6.0);
    add_that_node(1, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (1.0 / 6.0);
    add_that_node(2, x0 + r * cos(t), y0 + r * sin(t), 0.0);
    t = ref_math_pi * (0.0 / 6.0);
    add_that_node(3, x0 + r * cos(t), y0 + r * sin(t), 0.0);

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}